

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool Internal_IsUnsetDouble(size_t count,double *a)

{
  double dVar1;
  double *pdVar2;
  double x;
  double *e;
  double *a_local;
  size_t count_local;
  
  e = a;
  do {
    if (a + count <= e) {
      return false;
    }
    pdVar2 = e + 1;
    dVar1 = *e;
  } while (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
          ((e = pdVar2, dVar1 != 1.23432101234321e+308 || (NAN(dVar1)))));
  return true;
}

Assistant:

static bool Internal_IsUnsetDouble(
  size_t count,
  const double* a
)
{
  const double * e = a + count;
  while (a < e)
  {
    double x = *a++;
    if (ON_UNSET_VALUE == x || ON_UNSET_POSITIVE_VALUE == x)
      return true;
  }
  return false;
}